

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyCopyTLASAttribs(CopyTLASAttribs *Attribs)

{
  undefined *puVar1;
  RAYTRACING_BUILD_AS_FLAGS RVar2;
  Char *pCVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char (*in_RCX) [69];
  char (*Args_1) [62];
  undefined1 local_108 [8];
  string _msg;
  string msg_4;
  string msg_3;
  TopLevelASDesc *DstDesc_1;
  TopLevelASDesc *SrcDesc_1;
  string msg_2;
  TopLevelASDesc *DstDesc;
  TopLevelASDesc *SrcDesc;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  CopyTLASAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if (Attribs->pSrc == (ITopLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              ((string *)local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
               (char (*) [32])"pSrc must not be null.",(char (*) [23])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [69])0x3ee;
    DebugAssertionFailed
              (pCVar3,"VerifyCopyTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x3ee);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (*(long *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[32],char[23]>
              ((string *)&SrcDesc,(Diligent *)"Copy TLAS attribs are invalid: ",
               (char (*) [32])"pDst must not be null.",(char (*) [23])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [69])0x3ef;
    DebugAssertionFailed
              (pCVar3,"VerifyCopyTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x3ef);
    std::__cxx11::string::~string((string *)&SrcDesc);
  }
  if (*(char *)(msg.field_2._8_8_ + 0x10) == '\0') {
    lVar4 = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
    msg_2.field_2._8_8_ = (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x20))();
    Args_1 = (char (*) [62])msg_2.field_2._8_8_;
    if ((*(int *)(lVar4 + 8) != *(int *)(*(char (*) [62])msg_2.field_2._8_8_ + 8)) ||
       (Args_1 = (char (*) [62])(ulong)(byte)(*(char (*) [62])msg_2.field_2._8_8_)[0xc],
       *(byte *)(lVar4 + 0xc) != (*(char (*) [62])msg_2.field_2._8_8_)[0xc])) {
      FormatString<char[32],char[62]>
                ((string *)&SrcDesc_1,(Diligent *)"Copy TLAS attribs are invalid: ",
                 (char (*) [32])"pDst must have been created with the same parameters as pSrc.",
                 Args_1);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"VerifyCopyTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3f7);
      std::__cxx11::string::~string((string *)&SrcDesc_1);
    }
  }
  else {
    if (*(char *)(msg.field_2._8_8_ + 0x10) != '\x01') {
      FormatString<char[40]>
                ((string *)local_108,(char (*) [40])"IDeviceContext::CopyTLAS: unknown Mode.");
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar6,0);
      }
      std::__cxx11::string::~string((string *)local_108);
      return false;
    }
    lVar4 = (**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
    lVar5 = (**(code **)(**(long **)(msg.field_2._8_8_ + 8) + 0x20))();
    RVar2 = operator&(*(RAYTRACING_BUILD_AS_FLAGS *)(lVar4 + 0xc),
                      RAYTRACING_BUILD_AS_ALLOW_COMPACTION);
    if (RVar2 != RAYTRACING_BUILD_AS_ALLOW_COMPACTION) {
      FormatString<char[32],char[69]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Copy TLAS attribs are invalid: ",
                 (char (*) [32])
                 "pSrc was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [69])0x3fe;
      DebugAssertionFailed
                (pCVar3,"VerifyCopyTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3fe);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if (*(long *)(lVar5 + 0x10) == 0) {
      FormatString<char[32],char[56]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Copy TLAS attribs are invalid: ",
                 (char (*) [32])"pDst must have been create with non-zero CompactedSize.",
                 (char (*) [56])in_RCX);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"VerifyCopyTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3ff);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
  }
  return true;
}

Assistant:

bool VerifyCopyTLASAttribs(const CopyTLASAttribs& Attribs)
{
#define CHECK_COPY_TLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Copy TLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_COPY_TLAS_ATTRIBS(Attribs.pSrc != nullptr, "pSrc must not be null.");
    CHECK_COPY_TLAS_ATTRIBS(Attribs.pDst != nullptr, "pDst must not be null.");

    if (Attribs.Mode == COPY_AS_MODE_CLONE)
    {
        const TopLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const TopLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_TLAS_ATTRIBS(SrcDesc.MaxInstanceCount == DstDesc.MaxInstanceCount && SrcDesc.Flags == DstDesc.Flags,
                                "pDst must have been created with the same parameters as pSrc.");
    }
    else if (Attribs.Mode == COPY_AS_MODE_COMPACT)
    {
        const TopLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const TopLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_TLAS_ATTRIBS((SrcDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION, "pSrc was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");
        CHECK_COPY_TLAS_ATTRIBS(DstDesc.CompactedSize != 0, "pDst must have been create with non-zero CompactedSize.");
    }
    else
    {
        LOG_ERROR_MESSAGE("IDeviceContext::CopyTLAS: unknown Mode.");
        return false;
    }
#undef CHECK_COPY_TLAS_ATTRIBS

    return true;
}